

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidator.cpp
# Opt level: O1

Result * validateNeuralNetworkTopLevel<CoreML::Specification::NeuralNetwork>
                   (Result *__return_storage_ptr__,ModelDescription *interface,NeuralNetwork *nn,
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *outputBlobNames,bool isUpdatable)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  int iVar3;
  mapped_type_conflict1 mVar4;
  uint32 uVar5;
  Rep *pRVar6;
  pointer pcVar7;
  long lVar8;
  void *pvVar9;
  bool bVar10;
  void **ppvVar11;
  RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription> RVar12;
  mapped_type_conflict1 *pmVar13;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this;
  ArrayFeatureType *pAVar14;
  ArrayFeatureType_EnumeratedShapes *pAVar15;
  iterator iVar16;
  _Base_ptr p_Var17;
  long lVar18;
  void **ppvVar19;
  NeuralNetwork *pNVar20;
  long lVar21;
  byte bVar22;
  int iVar23;
  undefined7 in_register_00000081;
  undefined8 *puVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  Result r;
  NeuralNetworkSpecValidator validator;
  NeuralNetworkShaper shaper;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ioBlobNameToRank;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  inputBlobs;
  pointer local_220;
  _Alloc_hider local_218;
  size_type local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  NeuralNetwork *local_1f0;
  undefined1 local_1e8 [8];
  _Alloc_hider local_1e0;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [72];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_180;
  undefined4 local_144;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_140;
  undefined1 local_118 [8];
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  local_e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_60;
  
  local_144 = (undefined4)CONCAT71(in_register_00000081,isUpdatable);
  local_140 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)outputBlobNames;
  CoreML::Result::Result((Result *)&local_220);
  pRVar6 = (interface->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar11 = pRVar6->elements;
  if (pRVar6 == (Rep *)0x0) {
    ppvVar11 = (void **)0x0;
  }
  lVar18 = (long)(interface->input_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar18 == 0) {
    bVar25 = true;
  }
  else {
    bVar22 = 0;
    lVar21 = 0;
    do {
      puVar24 = *(undefined8 **)(*(long *)((long)ppvVar11 + lVar21) + 0x20);
      if (puVar24 == (undefined8 *)0x0) {
        puVar24 = &CoreML::Specification::_FeatureType_default_instance_;
      }
      if (*(int *)((long)puVar24 + 0x24) == 5) {
        bVar22 = 1;
        break;
      }
      bVar25 = lVar18 * 8 + -8 != lVar21;
      lVar21 = lVar21 + 8;
    } while (bVar25);
    bVar25 = (bool)(bVar22 ^ 1);
  }
  iVar3 = nn->arrayinputshapemapping_;
  iVar23 = nn->imageinputshapemapping_;
  pRVar6 = (nn->layers_).super_RepeatedPtrFieldBase.rep_;
  ppvVar11 = pRVar6->elements;
  if (pRVar6 == (Rep *)0x0) {
    ppvVar11 = (void **)0x0;
  }
  lVar18 = (long)(nn->layers_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar18 == 0) {
    bVar22 = 0;
  }
  else {
    local_1f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_1f8._4_4_,iVar23);
    lVar21 = 0;
    bVar22 = 0;
    local_1f0 = nn;
    do {
      bVar10 = CoreML::isIOS12NeuralNetworkLayer(*(NeuralNetworkLayer **)((long)ppvVar11 + lVar21));
      if (!bVar10) {
        bVar22 = 1;
      }
      bVar26 = lVar18 * 8 + -8 != lVar21;
      lVar21 = lVar21 + 8;
    } while (bVar10 && bVar26);
    nn = local_1f0;
    iVar23 = (int)local_1f8;
  }
  bVar10 = iVar3 != 0;
  if (((~bVar22 & 1) == 0 && !bVar25) && !bVar10) {
    local_1e8 = (undefined1  [8])local_1d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,
               "Neural Network Multi-Array input shape mapping cannot be \'RANK5_ARRAY_MAPPING\' if the network contains a layer added in version 4 (iOS 13) or later. Use \'EXACT_ARRAY_MAPPING\' instead."
               ,"");
    CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_1e8);
  }
  else if ((iVar3 == 0 && iVar23 != 0) && !bVar25) {
    local_1e8 = (undefined1  [8])local_1d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,
               "Neural Network Multi-Array input shape mapping cannot be \'RANK5_ARRAY_MAPPING\' if the image input Shape mapping is not \'RANK5_IMAGE_MAPPING\'"
               ,"");
    CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_1e8);
  }
  else if ((interface->input_).super_RepeatedPtrFieldBase.current_size_ == 0) {
    local_1e8 = (undefined1  [8])local_1d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,"Neural networks require at least one input.","");
    CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_1e8);
  }
  else if ((interface->output_).super_RepeatedPtrFieldBase.current_size_ == 0) {
    local_1e8 = (undefined1  [8])local_1d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,"Neural networks produce at least one output.","");
    CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_1e8);
  }
  else if ((nn->layers_).super_RepeatedPtrFieldBase.current_size_ == 0) {
    local_1e8 = (undefined1  [8])local_1d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,"Neural networks require at least one layer.","");
    CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1e8);
  }
  else {
    pRVar6 = (interface->input_).super_RepeatedPtrFieldBase.rep_;
    ppvVar11 = pRVar6->elements;
    if (pRVar6 == (Rep *)0x0) {
      ppvVar11 = (void **)0x0;
    }
    iVar3 = (interface->input_).super_RepeatedPtrFieldBase.current_size_;
    RVar12 = std::
             __find_if<google::protobuf::internal::RepeatedPtrIterator<CoreML::Specification::FeatureDescription_const>,__gnu_cxx::__ops::_Iter_negate<validateNeuralNetworkTopLevel<CoreML::Specification::NeuralNetwork>(CoreML::Specification::ModelDescription_const&,CoreML::Specification::NeuralNetwork_const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&,bool)::_lambda(CoreML::Specification::FeatureDescription_const&)_1_>>
                       (ppvVar11,ppvVar11 + iVar3);
    if (RVar12.it_ != ppvVar11 + iVar3) {
      local_1e8 = (undefined1  [8])local_1d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"inputs","");
      CoreML::validateInputOutputTypes
                (__return_storage_ptr__,&interface->input_,MODEL_INPUT_TYPE_INVALID,
                 (string *)local_1e8);
      if (local_1e8 != (undefined1  [8])local_1d8) {
        operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
      }
      bVar25 = CoreML::Result::good(__return_storage_ptr__);
      if (!bVar25) goto LAB_004f637f;
      bVar22 = bVar22 | iVar23 != 0;
      pcVar7 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
      paVar1 = &(__return_storage_ptr__->m_message).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar7 != paVar1) {
        operator_delete(pcVar7,paVar1->_M_allocated_capacity + 1);
      }
      local_90._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_90._M_impl.super__Rb_tree_header._M_header;
      local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_1f8 = paVar1;
      local_90._M_impl.super__Rb_tree_header._M_header._M_right =
           local_90._M_impl.super__Rb_tree_header._M_header._M_left;
      if (bVar10 || bVar22 != 0) {
        pRVar6 = (interface->input_).super_RepeatedPtrFieldBase.rep_;
        ppvVar11 = pRVar6->elements;
        if (pRVar6 == (Rep *)0x0) {
          ppvVar11 = (void **)0x0;
        }
        lVar18 = (long)(interface->input_).super_RepeatedPtrFieldBase.current_size_;
        if (lVar18 != 0) {
          lVar21 = 0;
          do {
            lVar8 = *(long *)((long)ppvVar11 + lVar21);
            puVar24 = *(undefined8 **)(lVar8 + 0x20);
            if (puVar24 == (undefined8 *)0x0) {
              puVar24 = &CoreML::Specification::_FeatureType_default_instance_;
            }
            if (*(int *)((long)puVar24 + 0x24) == 4) {
              if (nn->imageinputshapemapping_ == 0) {
                pmVar13 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                        *)&local_90,*(key_type **)(lVar8 + 0x10));
LAB_004f5c19:
                *pmVar13 = 5;
              }
              else {
                pmVar13 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                        *)&local_90,*(key_type **)(lVar8 + 0x10));
                *pmVar13 = 4;
              }
            }
            else if (*(int *)((long)puVar24 + 0x24) == 5) {
              if (nn->arrayinputshapemapping_ == 0) {
                pmVar13 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                        *)&local_90,*(key_type **)(lVar8 + 0x10));
                goto LAB_004f5c19;
              }
              mVar4 = *(mapped_type_conflict1 *)(puVar24[3] + 0x10);
              pmVar13 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                      *)&local_90,*(key_type **)(lVar8 + 0x10));
              *pmVar13 = mVar4;
            }
            lVar21 = lVar21 + 8;
          } while (lVar18 * 8 != lVar21);
        }
        pRVar6 = (interface->output_).super_RepeatedPtrFieldBase.rep_;
        pNVar20 = (NeuralNetwork *)pRVar6->elements;
        if (pRVar6 == (Rep *)0x0) {
          pNVar20 = (NeuralNetwork *)0x0;
        }
        lVar18 = (long)(interface->output_).super_RepeatedPtrFieldBase.current_size_;
        if (lVar18 != 0) {
          lVar21 = 0;
          local_1f0 = pNVar20;
          do {
            lVar8 = *(long *)((long)&(pNVar20->super_MessageLite)._vptr_MessageLite + lVar21);
            puVar24 = *(undefined8 **)(lVar8 + 0x20);
            if (puVar24 == (undefined8 *)0x0) {
              puVar24 = &CoreML::Specification::_FeatureType_default_instance_;
            }
            if ((*(int *)((long)puVar24 + 0x24) == 5) && (*(int *)(puVar24[3] + 0x10) != 0)) {
              puVar24 = *(undefined8 **)(lVar8 + 0x20);
              if (puVar24 == (undefined8 *)0x0) {
                puVar24 = &CoreML::Specification::_FeatureType_default_instance_;
              }
              if (*(int *)((long)puVar24 + 0x24) == 5) {
                pAVar14 = (ArrayFeatureType *)puVar24[3];
              }
              else {
                pAVar14 = CoreML::Specification::ArrayFeatureType::default_instance();
              }
              iVar3 = (pAVar14->shape_).current_size_;
              pmVar13 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                      *)&local_90,*(key_type **)(lVar8 + 0x10));
              *pmVar13 = iVar3;
              pNVar20 = local_1f0;
            }
            lVar21 = lVar21 + 8;
          } while (lVar18 * 8 != lVar21);
        }
      }
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      pRVar6 = (interface->input_).super_RepeatedPtrFieldBase.rep_;
      ppvVar11 = pRVar6->elements;
      if (pRVar6 == (Rep *)0x0) {
        ppvVar11 = (void **)0x0;
      }
      lVar18 = (long)(interface->input_).super_RepeatedPtrFieldBase.current_size_;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      if (lVar18 != 0) {
        local_1f0 = (NeuralNetwork *)(ppvVar11 + lVar18);
        do {
          pvVar9 = *ppvVar11;
          local_1e8 = (undefined1  [8])local_1d8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"__input","");
          this = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                  *)&local_60,*(key_type **)((long)pvVar9 + 0x10));
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_assign_unique<std::__cxx11::string_const*>
                    (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8)
          ;
          if (local_1e8 != (undefined1  [8])local_1d8) {
            operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
          }
          puVar24 = *(undefined8 **)((long)pvVar9 + 0x20);
          if (puVar24 == (undefined8 *)0x0) {
            puVar24 = &CoreML::Specification::_FeatureType_default_instance_;
          }
          if (*(int *)((long)puVar24 + 0x24) == 5) {
            if (!bVar10 && bVar22 == 0) {
              if (*(int *)(puVar24[3] + 0x10) < 1) {
                bVar25 = false;
LAB_004f5e87:
                puVar24 = *(undefined8 **)((long)pvVar9 + 0x20);
                if (puVar24 == (undefined8 *)0x0) {
                  puVar24 = &CoreML::Specification::_FeatureType_default_instance_;
                }
                if (*(int *)((long)puVar24 + 0x24) == 5) {
                  pAVar14 = (ArrayFeatureType *)puVar24[3];
                }
                else {
                  pAVar14 = CoreML::Specification::ArrayFeatureType::default_instance();
                }
                uVar5 = pAVar14->_oneof_case_[0];
                if (uVar5 == 0) {
LAB_004f5fbe:
                  bVar26 = bVar25;
                  if (!bVar25) {
                    local_1e8 = (undefined1  [8])local_1d8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1e8,
                               "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays)."
                               ,"");
                    CoreML::Result::Result
                              (__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_1e8);
                    goto LAB_004f6523;
                  }
                }
                else {
                  bVar26 = true;
                  if (uVar5 == 0x15) {
                    puVar24 = *(undefined8 **)((long)pvVar9 + 0x20);
                    if (puVar24 == (undefined8 *)0x0) {
                      puVar24 = &CoreML::Specification::_FeatureType_default_instance_;
                    }
                    if (*(int *)((long)puVar24 + 0x24) == 5) {
                      pAVar14 = (ArrayFeatureType *)puVar24[3];
                    }
                    else {
                      pAVar14 = CoreML::Specification::ArrayFeatureType::default_instance();
                    }
                    if (pAVar14->_oneof_case_[0] == 0x15) {
                      pAVar15 = (pAVar14->ShapeFlexibility_).enumeratedshapes_;
                    }
                    else {
                      pAVar15 = CoreML::Specification::ArrayFeatureType_EnumeratedShapes::
                                default_instance();
                    }
                    pRVar6 = (pAVar15->shapes_).super_RepeatedPtrFieldBase.rep_;
                    ppvVar19 = pRVar6->elements;
                    if (pRVar6 == (Rep *)0x0) {
                      ppvVar19 = (void **)0x0;
                    }
                    lVar18 = (long)(pAVar15->shapes_).super_RepeatedPtrFieldBase.current_size_;
                    if (lVar18 != 0) {
                      bVar28 = true;
                      lVar21 = 0;
                      do {
                        if ((*(uint *)(*(long *)((long)ppvVar19 + lVar21) + 0x10) | 2) != 3) {
                          bVar28 = false;
                          break;
                        }
                        bVar27 = lVar18 * 8 + -8 != lVar21;
                        lVar21 = lVar21 + 8;
                      } while (bVar27);
LAB_004f5fba:
                      if (!bVar28) goto LAB_004f5fbe;
                    }
                  }
                  else if (uVar5 == 0x1f) {
                    puVar24 = *(undefined8 **)((long)pvVar9 + 0x20);
                    if (puVar24 == (undefined8 *)0x0) {
                      puVar24 = &CoreML::Specification::_FeatureType_default_instance_;
                    }
                    if (*(int *)((long)puVar24 + 0x24) == 5) {
                      pAVar14 = (ArrayFeatureType *)puVar24[3];
                    }
                    else {
                      pAVar14 = CoreML::Specification::ArrayFeatureType::default_instance();
                    }
                    if (pAVar14->_oneof_case_[0] == 0x1f) {
                      pAVar15 = (pAVar14->ShapeFlexibility_).enumeratedshapes_;
                    }
                    else {
                      pAVar15 = (ArrayFeatureType_EnumeratedShapes *)
                                CoreML::Specification::ArrayFeatureType_ShapeRange::default_instance
                                          ();
                    }
                    if ((pAVar15->shapes_).super_RepeatedPtrFieldBase.current_size_ != 1) {
                      puVar24 = *(undefined8 **)((long)pvVar9 + 0x20);
                      if (puVar24 == (undefined8 *)0x0) {
                        puVar24 = &CoreML::Specification::_FeatureType_default_instance_;
                      }
                      if (*(int *)((long)puVar24 + 0x24) == 5) {
                        pAVar14 = (ArrayFeatureType *)puVar24[3];
                      }
                      else {
                        pAVar14 = CoreML::Specification::ArrayFeatureType::default_instance();
                      }
                      if (pAVar14->_oneof_case_[0] == 0x1f) {
                        pAVar15 = (pAVar14->ShapeFlexibility_).enumeratedshapes_;
                      }
                      else {
                        pAVar15 = (ArrayFeatureType_EnumeratedShapes *)
                                  CoreML::Specification::ArrayFeatureType_ShapeRange::
                                  default_instance();
                      }
                      bVar28 = (pAVar15->shapes_).super_RepeatedPtrFieldBase.current_size_ == 3;
                      goto LAB_004f5fba;
                    }
                  }
                }
                if (bVar26) goto LAB_004f5fdb;
                local_1e8 = (undefined1  [8])local_1d8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1e8,
                           "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays)."
                           ,"");
                CoreML::Result::Result
                          (__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_1e8);
              }
              else {
                puVar24 = *(undefined8 **)((long)pvVar9 + 0x20);
                if (puVar24 == (undefined8 *)0x0) {
                  puVar24 = &CoreML::Specification::_FeatureType_default_instance_;
                }
                if (*(int *)((long)puVar24 + 0x24) == 5) {
                  pAVar14 = (ArrayFeatureType *)puVar24[3];
                }
                else {
                  pAVar14 = CoreML::Specification::ArrayFeatureType::default_instance();
                }
                bVar25 = true;
                if ((pAVar14->shape_).current_size_ == 1) goto LAB_004f5e87;
                puVar24 = *(undefined8 **)((long)pvVar9 + 0x20);
                if (puVar24 == (undefined8 *)0x0) {
                  puVar24 = &CoreML::Specification::_FeatureType_default_instance_;
                }
                if (*(int *)((long)puVar24 + 0x24) == 5) {
                  pAVar14 = (ArrayFeatureType *)puVar24[3];
                }
                else {
                  pAVar14 = CoreML::Specification::ArrayFeatureType::default_instance();
                }
                if ((pAVar14->shape_).current_size_ == 3) goto LAB_004f5e87;
                local_1e8 = (undefined1  [8])local_1d8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1e8,
                           "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays)."
                           ,"");
                CoreML::Result::Result
                          (__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_1e8);
              }
LAB_004f6523:
              if (local_1e8 != (undefined1  [8])local_1d8) {
                operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
              }
              goto LAB_004f641d;
            }
            puVar24 = *(undefined8 **)((long)pvVar9 + 0x20);
            if (puVar24 == (undefined8 *)0x0) {
              puVar24 = &CoreML::Specification::_FeatureType_default_instance_;
            }
            if (*(int *)((long)puVar24 + 0x24) == 5) {
              pAVar14 = (ArrayFeatureType *)puVar24[3];
            }
            else {
              pAVar14 = CoreML::Specification::ArrayFeatureType::default_instance();
            }
            CoreML::validateNdMultiArrayInputType((Result *)local_1e8,pAVar14);
            local_220 = (pointer)local_1e8;
            std::__cxx11::string::operator=((string *)&local_218,(string *)&local_1e0);
            bVar25 = CoreML::Result::good((Result *)&local_220);
            if (local_1e0._M_p != local_1d8 + 8) {
              operator_delete(local_1e0._M_p,local_1d8._8_8_ + 1);
            }
            if (!bVar25) {
              *(pointer *)__return_storage_ptr__ = local_220;
              (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)local_1f8;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_p == &local_208) {
                local_1f8->_M_allocated_capacity =
                     CONCAT71(local_208._M_allocated_capacity._1_7_,local_208._M_local_buf[0]);
                *(undefined8 *)((long)local_1f8 + 8) = local_208._8_8_;
              }
              else {
                (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_218._M_p;
                (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
                     CONCAT71(local_208._M_allocated_capacity._1_7_,local_208._M_local_buf[0]);
              }
              (__return_storage_ptr__->m_message)._M_string_length = local_210;
              local_210 = 0;
              local_208._M_local_buf[0] = '\0';
              local_218._M_p = (pointer)&local_208;
              goto LAB_004f641d;
            }
          }
LAB_004f5fdb:
          ppvVar11 = ppvVar11 + 1;
        } while ((NeuralNetwork *)ppvVar11 != local_1f0);
      }
      CoreML::NeuralNetworkSpecValidator::NeuralNetworkSpecValidator
                ((NeuralNetworkSpecValidator *)local_1e8,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  *)&local_60,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)&local_90,(bool)(bVar10 | bVar22),0,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)&local_90);
      CoreML::NeuralNetworkSpecValidator::
      validateNeuralNetwork<CoreML::Specification::NeuralNetwork>
                ((Result *)local_118,(NeuralNetworkSpecValidator *)local_1e8,nn);
      local_220 = (pointer)local_118;
      std::__cxx11::string::operator=((string *)&local_218,(string *)&local_110);
      paVar1 = local_1f8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_p != local_100) {
        operator_delete(local_110._M_p,local_100[0]._M_allocated_capacity + 1);
      }
      bVar25 = CoreML::Result::good((Result *)&local_220);
      if (bVar25) {
        p_Var2 = &local_180._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)local_180._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2)
        {
          p_Var17 = local_180._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            iVar16 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::find(&local_60,(key_type *)(p_Var17 + 1));
            if (((_Rb_tree_header *)iVar16._M_node == &local_60._M_impl.super__Rb_tree_header) ||
               ((_Base_ptr)0x1 < p_Var17[3]._M_parent)) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        (local_140,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var17 + 1));
            }
            p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
          } while ((_Rb_tree_header *)p_Var17 != p_Var2);
        }
        if (!bVar10 && bVar22 == 0) {
          CoreML::NeuralNetworkShaper::NeuralNetworkShaper
                    ((NeuralNetworkShaper *)local_118,interface,&nn->layers_,true);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
          ::~_Rb_tree(&local_e0);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                       *)&local_110);
        }
        bVar25 = CoreML::Result::good((Result *)&local_220);
        paVar1 = local_1f8;
        if ((bVar25) && ((char)local_144 != '\0')) {
          validateUpdatableNeuralNetwork<CoreML::Specification::NeuralNetwork>
                    ((Result *)local_118,nn);
          local_220 = (pointer)local_118;
          std::__cxx11::string::operator=((string *)&local_218,(string *)&local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_p != local_100) {
            operator_delete(local_110._M_p,local_100[0]._M_allocated_capacity + 1);
          }
          bVar25 = CoreML::Result::good((Result *)&local_220);
          if (bVar25) {
            validateTrainingInputs<CoreML::Specification::NeuralNetwork>
                      ((Result *)local_118,interface,nn);
            local_220 = (pointer)local_118;
            std::__cxx11::string::operator=((string *)&local_218,(string *)&local_110);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_p != local_100) {
              operator_delete(local_110._M_p,local_100[0]._M_allocated_capacity + 1);
            }
            CoreML::Result::good((Result *)&local_220);
          }
        }
        *(pointer *)__return_storage_ptr__ = local_220;
        (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_p == &local_208) {
          paVar1->_M_allocated_capacity =
               CONCAT71(local_208._M_allocated_capacity._1_7_,local_208._M_local_buf[0]);
          *(undefined8 *)((long)paVar1 + 8) = local_208._8_8_;
        }
        else {
LAB_004f63c8:
          (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_218._M_p;
          (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
               CONCAT71(local_208._M_allocated_capacity._1_7_,local_208._M_local_buf[0]);
        }
      }
      else {
        *(pointer *)__return_storage_ptr__ = local_220;
        (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_p != &local_208) goto LAB_004f63c8;
        paVar1->_M_allocated_capacity =
             CONCAT71(local_208._M_allocated_capacity._1_7_,local_208._M_local_buf[0]);
        *(undefined8 *)((long)paVar1 + 8) = local_208._8_8_;
      }
      local_218._M_p = (pointer)&local_208;
      (__return_storage_ptr__->m_message)._M_string_length = local_210;
      local_210 = 0;
      local_208._M_local_buf[0] = '\0';
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_180);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)(local_1c8 + 0x18));
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)&local_1e0);
LAB_004f641d:
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_60);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree(&local_90);
      goto LAB_004f637f;
    }
    local_1e8 = (undefined1  [8])local_1d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,"Neural networks require at least one non-optional input.","");
    CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_1e8);
  }
  if (local_1e8 != (undefined1  [8])local_1d8) {
    operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
  }
LAB_004f637f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_p != &local_208) {
    operator_delete(local_218._M_p,
                    CONCAT71(local_208._M_allocated_capacity._1_7_,local_208._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateNeuralNetworkTopLevel(const Specification::ModelDescription& interface,
                                     const T& nn, std::set<std::string>& outputBlobNames,
                                     bool isUpdatable) {
    Result r;
    
    // First calculate the value of the flag "ndArrayInterpretation"
    // ndArrayInterpretation == False ==> iOS 11/12 (old) execution path can be used, i.e. all tensors are static rank 5.
    // ndArrayInterpretation == True ==>  Tensors can have any rank (including 5).
    
    bool ndArrayInterpretation = false;

    bool hasNonIOS12Layer = false;
    bool hasNewArrayShapeMapping = false;
    bool hasNewImageShapeMapping = false;
    bool hasMultiArrayInput = false;

    for (const auto& input: interface.input()) {
        if (input.type().Type_case() == Specification::FeatureType::kMultiArrayType) {
            hasMultiArrayInput = true;
            break;
        }
    }
    
    if (nn.arrayinputshapemapping() != Specification::NeuralNetworkMultiArrayShapeMapping::RANK5_ARRAY_MAPPING) {
        hasNewArrayShapeMapping = true;
    }
    
    if (nn.imageinputshapemapping() != Specification::NeuralNetworkImageShapeMapping::RANK5_IMAGE_MAPPING) {
        hasNewImageShapeMapping = true;
    }
    
    for (const auto &layer: nn.layers()) {
        if (!isIOS12NeuralNetworkLayer(layer)) {
            hasNonIOS12Layer = true;
            break;
        }
    }
    
    if (hasNonIOS12Layer || hasNewArrayShapeMapping || hasNewImageShapeMapping) {
        ndArrayInterpretation = true;
    }
    
    if (hasNonIOS12Layer && !hasNewArrayShapeMapping && hasMultiArrayInput) {
        return Result(ResultType::INVALID_MODEL_INTERFACE,
                      "Neural Network Multi-Array input shape mapping cannot be 'RANK5_ARRAY_MAPPING' if the network contains a layer added in version 4 (iOS 13) or later. Use 'EXACT_ARRAY_MAPPING' instead.");
    }
    
    if (!hasNewArrayShapeMapping && hasNewImageShapeMapping && hasMultiArrayInput) {
        return Result(ResultType::INVALID_MODEL_INTERFACE,
                      "Neural Network Multi-Array input shape mapping cannot be 'RANK5_ARRAY_MAPPING' if the image input Shape mapping is not 'RANK5_IMAGE_MAPPING'");
    }
    
    //==================== End of logic to determine the value of "ndArrayInterpretation" ======================
    
    if (interface.input_size() == 0) {
        return Result(ResultType::INVALID_MODEL_INTERFACE,
                      "Neural networks require at least one input.");
    }
    
    if (interface.output_size() == 0) {
        return Result(ResultType::INVALID_MODEL_INTERFACE,
                      "Neural networks produce at least one output.");
    }
    
    if (nn.layers().size() == 0) {
        return Result(ResultType::INVALID_MODEL_PARAMETERS,
                      "Neural networks require at least one layer.");
    }
    
    if (std::all_of(interface.input().begin(), interface.input().end(),
                    [](const Specification::FeatureDescription& input) {
                        return input.type().isoptional();
                    })) {
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Neural networks require at least one non-optional input.");
                    }

    // Check the input types
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputTypes(interface.input(), ResultReason::MODEL_INPUT_TYPE_INVALID, "inputs"));

    std::map<std::string, int> ioBlobNameToRank; // to collect ranks of input/output blobs from the shapes present in the description
    
    // populate "ioBlobNameToRank"
    if (ndArrayInterpretation) {
        for (const auto& input: interface.input()) {
            if (input.type().Type_case() == Specification::FeatureType::kMultiArrayType) {
                if (nn.arrayinputshapemapping() == Specification::NeuralNetworkMultiArrayShapeMapping::RANK5_ARRAY_MAPPING) {
                    ioBlobNameToRank[input.name()] = 5;
                } else {
                    ioBlobNameToRank[input.name()] = input.type().multiarraytype().shape_size();
                }
            } else if (input.type().Type_case() == Specification::FeatureType::kImageType) {
                if (nn.imageinputshapemapping() == Specification::NeuralNetworkImageShapeMapping::RANK5_IMAGE_MAPPING) {
                    ioBlobNameToRank[input.name()] = 5;
                } else {
                    ioBlobNameToRank[input.name()] = 4;
                }
            }
        }
        for (const auto& output: interface.output()) {
            if (output.type().Type_case() == Specification::FeatureType::kMultiArrayType) {
                if (output.type().multiarraytype().shape_size()) {
                    ioBlobNameToRank[output.name()] = output.type().multiarraytype().shape_size();
                }
            }
        }
    }
    
    // Collect Model input names and do some checking
    
    // inputBlobs: For each named data blob, the name of the node which produced it (there can be multiple in if-else branches)
    std::map<std::string, std::set<std::string>> inputBlobs;
    for (const auto& input: interface.input()) {
        // For input blobs, we'll give them a dummy producing layer name
        inputBlobs[input.name()] = {"__input"};
        if (input.type().Type_case() == Specification::FeatureType::kMultiArrayType) {
            
            if (!ndArrayInterpretation) {
                
                // only vector-like (rank 1) or image-like (rank 3) inputs are allowed
                bool validShapeFound = false;
                if (input.type().multiarraytype().shape().size() > 0) {
                    if (!(input.type().multiarraytype().shape().size() == 1
                          || input.type().multiarraytype().shape().size() == 3)) {
                        return Result(ResultType::INVALID_MODEL_INTERFACE, "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays).");
                    }
                    else {
                        validShapeFound = true;
                    }
                }
                bool flexibilityIsRank1or3 = true;
                switch (input.type().multiarraytype().ShapeFlexibility_case()) {
                    case CoreML::Specification::ArrayFeatureType::kEnumeratedShapes:
                        for (const auto &shape : input.type().multiarraytype().enumeratedshapes().shapes()) {
                            if(shape.shape_size() != 1 && shape.shape_size() != 3) {
                                flexibilityIsRank1or3 = false;
                                break;
                            }
                        }
                        break;
                    case CoreML::Specification::ArrayFeatureType::kShapeRange:
                        flexibilityIsRank1or3 = (input.type().multiarraytype().shaperange().sizeranges_size() == 1 ||
                                                 input.type().multiarraytype().shaperange().sizeranges_size() == 3);
                        break;
                    case CoreML::Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                        flexibilityIsRank1or3 = false;
                        break;
                }
                if (!flexibilityIsRank1or3 && !validShapeFound) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE, "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays).");
                } else if (flexibilityIsRank1or3) {
                    validShapeFound = true;
                }
                if (!validShapeFound) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE, "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays).");
                }
                
            } else { // validate input shape when "ndArrayInterpretation" is True

                if (!(r = validateNdMultiArrayInputType(input.type().multiarraytype())).good()) {
                    return r;
                }
            } // if else block on spec version to check validity of input shape
        }
    }
    
    // validate the Neural Network message
    
    //  create an object to validate neural network message
    NeuralNetworkSpecValidator validator(inputBlobs, ioBlobNameToRank, ndArrayInterpretation, 0, ioBlobNameToRank);
    
    r = validator.validateNeuralNetwork(nn);
    
    if (!r.good()) {
        return r;
    }
    
    // gather all output blobs of the graph
    for (auto& blob: validator.blobs){
        if (inputBlobs.find(blob.first) == inputBlobs.end()) {
            outputBlobNames.insert(blob.first);
        } else {
            // if we are here, this means this blob is also present in the set of "inputBlobs"
            // but it can still be a genuine output blob if multiple layers are generating it (e.g. copy layer)
            if (blob.second.size() > 1) {
                outputBlobNames.insert(blob.first);
            }
        }
    }
    
    // Call the shaper: compatibility with iOS 12
    if (!ndArrayInterpretation) {
        // Compute the shapes
        try {
            NeuralNetworkShaper shaper(interface, nn.layers());
        }
        catch(std::runtime_error& e) {
            std::string err = std::string("Error determining network blob shapes: ") + std::string(e.what());
            return Result(ResultType::POTENTIALLY_INVALID_NEURAL_NETWORK_SHAPES, err);
        }
    }
    
    if (!r.good()) {
        return r;
    }
    
    if (isUpdatable) {
        r = validateUpdatableNeuralNetwork(nn);
        if (!r.good()) { return r; }

        r = validateTrainingInputs(interface, nn);
        if (!r.good()) { return r; }
    }
    
    return r;
    
}